

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int,float,float>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,float *args_1,float *args_2)

{
  long lVar1;
  pointer pNVar2;
  Node *__p;
  Node *object;
  float *args_local_2;
  float *args_local_1;
  uint *args_local;
  ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
  *this_local;
  
  if (*(ulong *)(this + 0x10) <= *(ulong *)(this + 8)) {
    pNVar2 = std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>::
             allocate((allocator_type *)(this + 0x30),*(size_type *)(this + 0x10));
    *(pointer *)this = pNVar2;
    std::
    vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<unsigned_int>::Node*&>
              ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                *)(this + 0x18),(Node **)this);
    *(undefined8 *)(this + 8) = 0;
  }
  lVar1 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar1 + 1;
  __p = (Node *)(*(long *)this + lVar1 * 0x48);
  std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>::
  construct<mapbox::detail::Earcut<unsigned_int>::Node,unsigned_int,float,float>
            ((allocator_type *)(this + 0x30),__p,args,args_1,args_2);
  return __p;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }